

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core-test.cc
# Opt level: O0

void __thiscall IsStringTest_IsString_Test<char>::TestBody(IsStringTest_IsString_Test<char> *this)

{
  bool bVar1;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  string asStack_298 [7];
  undefined1 in_stack_fffffffffffffd6f;
  AssertionResult *in_stack_fffffffffffffd70;
  char *in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd8c;
  char *in_stack_fffffffffffffd90;
  Type in_stack_fffffffffffffd9c;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffda0;
  string local_258 [40];
  char *in_stack_fffffffffffffdd0;
  char *in_stack_fffffffffffffdd8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffde0;
  AssertionResult *in_stack_fffffffffffffde8;
  AssertHelper *in_stack_fffffffffffffdf0;
  AssertionResult local_1e8;
  string local_1d8 [48];
  AssertionResult local_1a8;
  string local_198 [48];
  AssertionResult local_168;
  string local_158 [48];
  AssertionResult local_128;
  string local_118 [48];
  AssertionResult local_e8;
  string local_d8 [48];
  AssertionResult local_a8;
  string local_98 [48];
  AssertionResult local_68;
  string local_58 [64];
  AssertionResult local_18;
  
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_58);
    testing::Message::~Message((Message *)0x190142);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1901d6);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_98);
    testing::Message::~Message((Message *)0x1902bb);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x19034f);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_d8);
    testing::Message::~Message((Message *)0x190434);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1904c8);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_118);
    testing::Message::~Message((Message *)0x1905ad);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x190641);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_128);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_158);
    testing::Message::~Message((Message *)0x190726);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1907ba);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_168);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_198);
    testing::Message::~Message((Message *)0x19089f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x190933);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_1d8);
    testing::Message::~Message((Message *)0x190a18);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x190aac);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffde8);
    testing::Message::~Message((Message *)0x190b91);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x190c25);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffdd8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(local_258);
    testing::Message::~Message((Message *)0x190ce6);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x190d6b);
  testing::AssertionResult::AssertionResult
            (in_stack_fffffffffffffd70,(bool)in_stack_fffffffffffffd6f);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xfffffffffffffd98);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffda0.ptr_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffffde8,(char *)in_stack_fffffffffffffde0.ptr_,
               in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffffda0.ptr_,in_stack_fffffffffffffd9c,
               in_stack_fffffffffffffd90,in_stack_fffffffffffffd8c,in_stack_fffffffffffffd80);
    testing::internal::AssertHelper::operator=
              (in_stack_fffffffffffffdf0,(Message *)in_stack_fffffffffffffde8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd70);
    std::__cxx11::string::~string(asStack_298);
    testing::Message::~Message((Message *)0x190e23);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x190ea3);
  return;
}

Assistant:

TYPED_TEST(IsStringTest, IsString) {
  EXPECT_TRUE((fmt::internal::is_string<TypeParam *>::value));
  EXPECT_TRUE((fmt::internal::is_string<const TypeParam *>::value));
  EXPECT_TRUE((fmt::internal::is_string<TypeParam[2]>::value));
  EXPECT_TRUE((fmt::internal::is_string<const TypeParam[2]>::value));
  EXPECT_TRUE((fmt::internal::is_string<std::basic_string<TypeParam>>::value));
  EXPECT_TRUE(
        (fmt::internal::is_string<fmt::basic_string_view<TypeParam>>::value));
  EXPECT_TRUE(
        (fmt::internal::is_string<derived_from_string_view<TypeParam>>::value));
#ifdef FMT_STRING_VIEW
  EXPECT_TRUE((fmt::internal::is_string<FMT_STRING_VIEW<TypeParam>>::value));
#endif
  EXPECT_TRUE((fmt::internal::is_string<my_ns::my_string<TypeParam>>::value));
  EXPECT_FALSE((fmt::internal::is_string<my_ns::non_string>::value));
  EXPECT_TRUE((fmt::internal::is_string<FakeQt::QString>::value));
}